

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::ObjectAppearance
          (ObjectAppearance *this,KUINT8 PerCent,ObjectDamage OD,KBOOL Predist,KBOOL State,
          KBOOL Smoking,KBOOL Flaming)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  ObjectDamage local_18;
  KBOOL Flaming_local;
  KBOOL Smoking_local;
  KBOOL State_local;
  KBOOL Predist_local;
  ObjectDamage OD_local;
  KUINT8 PerCent_local;
  ObjectAppearance *this_local;
  
  local_1c = Flaming;
  local_1b = Smoking;
  local_1a = State;
  local_19 = Predist;
  local_18 = OD;
  Predist_local = (KBOOL)PerCent;
  _OD_local = this;
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__ObjectAppearance_00331370;
  if (100 < Predist_local) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"ObjectAppearance",&local_41);
    KException::KException<char_const*>(this_00,&local_40,8,"PerCent Acceptable values are 0-100.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xff00 | (ushort)Predist_local;
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xfcff |
       ((ushort)local_18 & 3) << 8;
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xfbff |
       (ushort)(local_19 & 1) << 10;
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xf7ff |
       (ushort)(local_1a & 1) << 0xb;
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xefff |
       (ushort)(local_1b & 1) << 0xc;
  (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
       (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance & 0xdfff |
       (ushort)(local_1c & 1) << 0xd;
  return;
}

Assistant:

ObjectAppearance::ObjectAppearance(KUINT8 PerCent, ObjectDamage OD, KBOOL Predist, KBOOL State,
                                   KBOOL Smoking, KBOOL Flaming) noexcept(false)
{
    if( PerCent > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "PerCent Acceptable values are 0-100." );

    m_GeneralAppearanceUnion.m_ui16PcComp = PerCent;
    m_GeneralAppearanceUnion.m_ui16Dmg = OD;
    m_GeneralAppearanceUnion.m_ui16Predistributed = Predist;
    m_GeneralAppearanceUnion.m_ui16State = State;
    m_GeneralAppearanceUnion.m_ui16Smoking = Smoking;
    m_GeneralAppearanceUnion.m_ui16Flaming = Flaming;
}